

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const(&)[17],unsigned_int&,char_const(&)[32],unsigned_int,char_const(&)[2],char_const&,char_const(&)[2]>
          (CompilerGLSL *this,char (*t) [17],uint *ts,char (*ts_1) [32],uint *ts_2,char (*ts_3) [2],
          char *ts_4,char (*ts_5) [2])

{
  StringStream<4096UL,_4096UL> *this_00;
  size_t sVar1;
  char local_39;
  uint32_t *local_38;
  
  this_00 = &this->buffer;
  local_38 = ts_2;
  sVar1 = strlen(*t);
  StringStream<4096UL,_4096UL>::append(this_00,*t,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::operator<<(this_00,*ts);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_1);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_1,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::operator<<(this_00,*local_38);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_3);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_3,sVar1);
  this->statement_count = this->statement_count + 1;
  local_39 = *ts_4;
  StringStream<4096UL,_4096UL>::append(this_00,&local_39,1);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_5);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_5,sVar1);
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}